

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9e2::
ARTScanTest_scanForwardThreeLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanForwardThreeLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  anon_class_16_2_56a65ec1 fn_00;
  value_view v;
  value_view v_00;
  value_view v_01;
  bool bVar1;
  const_reference pvVar2;
  char *message;
  AssertionResult gtest_ar;
  anon_class_16_2_56a65ec1 fn;
  uint64_t expected;
  uint64_t n;
  TypeParam *db;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  AssertHelper local_5a8;
  Message local_5a0;
  int local_594;
  AssertionResult local_590;
  uint64_t *local_580;
  uint64_t *puStackY_578;
  uint64_t *local_570;
  undefined8 in_stack_fffffffffffffa98;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaa0;
  uint64_t local_558;
  pointer local_550;
  size_t sStack_548;
  pointer local_540;
  size_t sStack_538;
  pointer local_520;
  size_t sStack_518;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffffaa0,SUB81((ulong)in_stack_fffffffffffffa98 >> 0x38,0));
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_520 = pvVar2->_M_ptr;
  sStack_518 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_540 = pvVar2->_M_ptr;
  sStack_538 = (pvVar2->_M_extent)._M_extent_value;
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,1,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_550 = pvVar2->_M_ptr;
  sStack_548 = (pvVar2->_M_extent)._M_extent_value;
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,2,v_01,false);
  local_558 = 0;
  local_580 = &local_558;
  puStackY_578 = (uint64_t *)&stack0xfffffffffffffaa0;
  fn_00.expected = puStackY_578;
  fn_00.n = local_580;
  local_570 = local_580;
  unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
  scan<(anonymous_namespace)::ARTScanTest_scanForwardThreeLeaves_Test<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::visitor<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator>const&)_1_>
            ((olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)local_508,
             fn_00,true);
  local_594 = 3;
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)&local_590,"(3)","(n)",&local_594,&local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    message = testing::AssertionResult::failure_message(&local_590);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x163,message);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult(&local_590);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanForwardThreeLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  verifier.insert(2, unodb::test::test_values[2]);
  uint64_t n = 0;
  uint64_t expected = 0;
  const auto fn = [&n, &expected](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    const auto key = decode(v.get_key());
    UNODB_EXPECT_EQ(expected, key);
    expected++;
    return false;
  };
  db.scan(fn, true /*fwd*/);
  UNODB_EXPECT_EQ(3, n);
}